

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscenebsptreeindex.cpp
# Opt level: O0

void __thiscall
QGraphicsSceneBspTreeIndexPrivate::_q_updateSortCache(QGraphicsSceneBspTreeIndexPrivate *this)

{
  iterator __first;
  QGraphicsSceneBspTreeIndex *pQVar1;
  qsizetype qVar2;
  const_reference ppQVar3;
  QGraphicsItemPrivate *pQVar4;
  QList<QGraphicsItem_*> *this_00;
  iterator in_RDI;
  long in_FS_OFFSET;
  int i_1;
  QGraphicsItem *item;
  int i;
  QGraphicsSceneBspTreeIndex *q;
  QList<QGraphicsItem_*> items;
  QList<QGraphicsItem_*> topLevels;
  int stackingOrder;
  parameter_type in_stack_ffffffffffffff68;
  QList<QGraphicsItem_*> *in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  int iVar5;
  int local_54;
  QGraphicsSceneBspTreeIndexPrivate *stackingOrder_00;
  QGraphicsItem *item_00;
  QGraphicsSceneBspTreeIndexPrivate *in_stack_ffffffffffffffd0;
  QList<QGraphicsItem_*> local_28;
  undefined4 local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  stackingOrder_00 = (QGraphicsSceneBspTreeIndexPrivate *)in_RDI.i;
  pQVar1 = q_func((QGraphicsSceneBspTreeIndexPrivate *)in_RDI.i);
  _q_updateIndex(in_stack_ffffffffffffffd0);
  if (((((QGraphicsSceneBspTreeIndexPrivate *)in_RDI.i)->sortCacheEnabled & 1U) != 0) &&
     ((((QGraphicsSceneBspTreeIndexPrivate *)in_RDI.i)->updatingSortCache & 1U) != 0)) {
    ((QGraphicsSceneBspTreeIndexPrivate *)in_RDI.i)->updatingSortCache = false;
    local_c = 0;
    local_28.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_28.d.ptr = (QGraphicsItem **)&DAT_aaaaaaaaaaaaaaaa;
    local_28.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    QList<QGraphicsItem_*>::QList((QList<QGraphicsItem_*> *)0xa1e6d8);
    item_00 = (QGraphicsItem *)&DAT_aaaaaaaaaaaaaaaa;
    (**(code **)(*(long *)&pQVar1->super_QGraphicsSceneIndex + 0x60))
              (&stack0xffffffffffffffc0,pQVar1,1);
    for (local_54 = 0;
        qVar2 = QList<QGraphicsItem_*>::size((QList<QGraphicsItem_*> *)&stack0xffffffffffffffc0),
        local_54 < qVar2; local_54 = local_54 + 1) {
      ppQVar3 = QList<QGraphicsItem_*>::at
                          (in_stack_ffffffffffffff70,(qsizetype)in_stack_ffffffffffffff68);
      if ((*ppQVar3 != (QGraphicsItem *)0x0) &&
         (pQVar4 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                   ::operator->(&(*ppQVar3)->d_ptr), pQVar4->parent == (QGraphicsItem *)0x0)) {
        QList<QGraphicsItem_*>::operator<<(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
      }
    }
    QList<QGraphicsItem_*>::begin(in_stack_ffffffffffffff70);
    QList<QGraphicsItem_*>::end(in_stack_ffffffffffffff70);
    __first.i._4_4_ = in_stack_ffffffffffffff8c;
    __first.i._0_4_ = in_stack_ffffffffffffff88;
    std::sort<QList<QGraphicsItem*>::iterator,bool(*)(QGraphicsItem_const*,QGraphicsItem_const*)>
              (__first,in_RDI,
               (_func_bool_QGraphicsItem_ptr_QGraphicsItem_ptr *)in_stack_ffffffffffffff68);
    iVar5 = 0;
    while( true ) {
      this_00 = (QList<QGraphicsItem_*> *)(long)iVar5;
      qVar2 = QList<QGraphicsItem_*>::size(&local_28);
      if (qVar2 <= (long)this_00) break;
      QList<QGraphicsItem_*>::at(this_00,(qsizetype)in_stack_ffffffffffffff68);
      climbTree(item_00,(int *)stackingOrder_00);
      iVar5 = iVar5 + 1;
    }
    QList<QGraphicsItem_*>::~QList((QList<QGraphicsItem_*> *)0xa1e822);
    QList<QGraphicsItem_*>::~QList((QList<QGraphicsItem_*> *)0xa1e82c);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGraphicsSceneBspTreeIndexPrivate::_q_updateSortCache()
{
    Q_Q(QGraphicsSceneBspTreeIndex);
    _q_updateIndex();

    if (!sortCacheEnabled || !updatingSortCache)
        return;

    updatingSortCache = false;
    int stackingOrder = 0;

    QList<QGraphicsItem *> topLevels;
    const QList<QGraphicsItem *> items = q->items();
    for (int i = 0; i < items.size(); ++i) {
        QGraphicsItem *item = items.at(i);
        if (item && !item->d_ptr->parent)
            topLevels << item;
    }

    std::sort(topLevels.begin(), topLevels.end(), qt_closestLeaf);
    for (int i = 0; i < topLevels.size(); ++i)
        climbTree(topLevels.at(i), &stackingOrder);
}